

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall Imath_3_2::Matrix33<float>::inverse(Matrix33<float> *this,bool singExc)

{
  float fVar1;
  float *pfVar2;
  invalid_argument *piVar3;
  byte in_DL;
  float *in_RSI;
  Matrix33<float> *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int j_3;
  int i_3;
  float mr_1;
  int j_2;
  int i_2;
  float r_1;
  Matrix33<float> s_1;
  int j_1;
  int i_1;
  float mr;
  int j;
  int i;
  float r;
  Matrix33<float> s;
  int local_98;
  int local_94;
  int local_8c;
  int local_88;
  Matrix33<float> local_80;
  int local_50;
  int local_4c;
  float local_48;
  int local_44;
  int local_40;
  float local_3c;
  Matrix33<float> local_38;
  byte local_11;
  
  local_11 = in_DL & 1;
  if ((((in_RSI[2] != 0.0) || (in_RSI[5] != 0.0)) || (NAN(in_RSI[5]))) ||
     ((in_RSI[8] != 1.0 || (NAN(in_RSI[8]))))) {
    Matrix33(&local_38,in_RSI[4] * in_RSI[8] + -(in_RSI[7] * in_RSI[5]),
             in_RSI[7] * in_RSI[2] + -(in_RSI[1] * in_RSI[8]),
             in_RSI[1] * in_RSI[5] + -(in_RSI[4] * in_RSI[2]),
             in_RSI[6] * in_RSI[5] + -(in_RSI[3] * in_RSI[8]),
             *in_RSI * in_RSI[8] + -(in_RSI[6] * in_RSI[2]),
             in_RSI[3] * in_RSI[2] + -(*in_RSI * in_RSI[5]),
             in_RSI[3] * in_RSI[7] + -(in_RSI[6] * in_RSI[4]),
             in_RSI[6] * in_RSI[1] + -(*in_RSI * in_RSI[7]),
             *in_RSI * in_RSI[4] + -(in_RSI[3] * in_RSI[1]));
    fVar4 = *in_RSI;
    pfVar2 = operator[](&local_38,0);
    fVar5 = *pfVar2;
    fVar6 = in_RSI[1];
    pfVar2 = operator[](&local_38,1);
    fVar7 = *pfVar2;
    fVar1 = in_RSI[2];
    pfVar2 = operator[](&local_38,2);
    local_3c = fVar1 * *pfVar2 + fVar4 * fVar5 + fVar6 * fVar7;
    fVar4 = abs<float>(local_3c);
    if (fVar4 < 1.0) {
      fVar4 = abs<float>(local_3c);
      fVar5 = std::numeric_limits<float>::min();
      local_48 = fVar4 / fVar5;
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        for (local_50 = 0; fVar4 = local_48, local_50 < 3; local_50 = local_50 + 1) {
          fVar5 = abs<float>(local_38.x[local_4c][local_50]);
          if (fVar4 <= fVar5) {
            if ((local_11 & 1) == 0) {
              Matrix33(in_RDI);
              return in_RDI;
            }
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar3,"Cannot invert singular matrix.");
            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          local_38.x[local_4c][local_50] = local_38.x[local_4c][local_50] / local_3c;
        }
      }
    }
    else {
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
          local_38.x[local_40][local_44] = local_38.x[local_40][local_44] / local_3c;
        }
      }
    }
    Matrix33(in_RDI,&local_38);
  }
  else {
    Matrix33(&local_80,in_RSI[4],-in_RSI[1],0.0,-in_RSI[3],*in_RSI,0.0,0.0,0.0,1.0);
    fVar4 = *in_RSI * in_RSI[4] + -(in_RSI[3] * in_RSI[1]);
    fVar5 = abs<float>(fVar4);
    if (fVar5 < 1.0) {
      fVar5 = abs<float>(fVar4);
      fVar6 = std::numeric_limits<float>::min();
      for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
        for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
          fVar7 = abs<float>(local_80.x[local_94][local_98]);
          if (fVar5 / fVar6 <= fVar7) {
            if ((local_11 & 1) == 0) {
              Matrix33(in_RDI);
              return in_RDI;
            }
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar3,"Cannot invert singular matrix.");
            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          local_80.x[local_94][local_98] = local_80.x[local_94][local_98] / fVar4;
        }
      }
    }
    else {
      for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
        for (local_8c = 0; local_8c < 2; local_8c = local_8c + 1) {
          local_80.x[local_88][local_8c] = local_80.x[local_88][local_8c] / fVar4;
        }
      }
    }
    local_80.x[2][0] = -in_RSI[6] * local_80.x[0][0] + -(in_RSI[7] * local_80.x[1][0]);
    local_80.x[2][1] = -in_RSI[6] * local_80.x[0][1] + -(in_RSI[7] * local_80.x[1][1]);
    Matrix33(in_RDI,&local_80);
  }
  return in_RDI;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::inverse (bool singExc) const
{
    if (x[0][2] != 0 || x[1][2] != 0 || x[2][2] != 1)
    {
        Matrix33 s (
            x[1][1] * x[2][2] - x[2][1] * x[1][2],
            x[2][1] * x[0][2] - x[0][1] * x[2][2],
            x[0][1] * x[1][2] - x[1][1] * x[0][2],

            x[2][0] * x[1][2] - x[1][0] * x[2][2],
            x[0][0] * x[2][2] - x[2][0] * x[0][2],
            x[1][0] * x[0][2] - x[0][0] * x[1][2],

            x[1][0] * x[2][1] - x[2][0] * x[1][1],
            x[2][0] * x[0][1] - x[0][0] * x[2][1],
            x[0][0] * x[1][1] - x[1][0] * x[0][1]);

        T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        return s;
    }
    else
    {
        Matrix33 s (
            x[1][1],
            -x[0][1],
            0,

            -x[1][0],
            x[0][0],
            0,

            0,
            0,
            1);

        T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        s.x[2][0] = -x[2][0] * s.x[0][0] - x[2][1] * s.x[1][0];
        s.x[2][1] = -x[2][0] * s.x[0][1] - x[2][1] * s.x[1][1];

        return s;
    }
}